

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPHashAlgorithm.cpp
# Opt level: O2

bool __thiscall OSSLEVPHashAlgorithm::hashFinal(OSSLEVPHashAlgorithm *this,ByteString *hashedData)

{
  EVP_MD_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *md;
  uint outLen;
  
  bVar1 = HashAlgorithm::hashFinal(&this->super_HashAlgorithm,hashedData);
  if (bVar1) {
    iVar2 = (*(this->super_HashAlgorithm)._vptr_HashAlgorithm[6])(this);
    iVar2 = EVP_MD_get_size(iVar2);
    ByteString::resize(hashedData,(long)iVar2);
    sVar3 = ByteString::size(hashedData);
    outLen = (uint)sVar3;
    ctx = (EVP_MD_CTX *)this->curCTX;
    md = ByteString::operator[](hashedData,0);
    iVar2 = EVP_DigestFinal_ex(ctx,md,&outLen);
    bVar1 = iVar2 != 0;
    if (iVar2 == 0) {
      softHSMLog(3,"hashFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPHashAlgorithm.cpp"
                 ,0x76,"EVP_DigestFinal failed");
    }
    else {
      ByteString::resize(hashedData,(ulong)outLen);
    }
    EVP_MD_CTX_free(this->curCTX);
    this->curCTX = (EVP_MD_CTX *)0x0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool OSSLEVPHashAlgorithm::hashFinal(ByteString& hashedData)
{
	if (!HashAlgorithm::hashFinal(hashedData))
	{
		return false;
	}

	hashedData.resize(EVP_MD_size(getEVPHash()));
	unsigned int outLen = hashedData.size();

	if (!EVP_DigestFinal_ex(curCTX, &hashedData[0], &outLen))
	{
		ERROR_MSG("EVP_DigestFinal failed");

		EVP_MD_CTX_free(curCTX);
		curCTX = NULL;

		return false;
	}

	hashedData.resize(outLen);

	EVP_MD_CTX_free(curCTX);
	curCTX = NULL;

	return true;
}